

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

AST_NodePtr __thiscall chaiscript::ChaiScript::parse(ChaiScript *this,string *t_input)

{
  bool bVar1;
  eval_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  AST_NodePtr AVar2;
  allocator local_d31;
  string local_d30;
  string local_d10;
  ChaiScript_Parser parser;
  
  chaiscript::parser::ChaiScript_Parser::ChaiScript_Parser(&parser);
  std::__cxx11::string::string((string *)&local_d10,"PARSE",(allocator *)&local_d30);
  bVar1 = chaiscript::parser::ChaiScript_Parser::parse(&parser,t_input,&local_d10);
  std::__cxx11::string::~string((string *)&local_d10);
  if (bVar1) {
    chaiscript::parser::ChaiScript_Parser::optimized_ast
              ((ChaiScript_Parser *)this,SUB81(&parser,0),false);
    chaiscript::parser::ChaiScript_Parser::~ChaiScript_Parser(&parser);
    AVar2.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    AVar2.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (AST_NodePtr)AVar2.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (eval_error *)__cxa_allocate_exception(0x90);
  std::__cxx11::string::string((string *)&local_d30,"Unknown error while parsing",&local_d31);
  exception::eval_error::eval_error(this_00,&local_d30);
  __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

static AST_NodePtr parse(const std::string &t_input)
    {
      parser::ChaiScript_Parser parser;
      if (parser.parse(t_input, "PARSE")) {
        //parser.show_match_stack();
        return parser.optimized_ast();
      } else {
        throw chaiscript::exception::eval_error("Unknown error while parsing");
      }
    }